

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O3

void __thiscall
Js::FunctionCodeGenRuntimeData::SetupRecursiveInlineeChain
          (FunctionCodeGenRuntimeData *this,Recycler *recycler,ProfileId profiledCallSiteId,
          FunctionBody *inlinee)

{
  Type *addr;
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  FunctionBody *pFVar6;
  Recycler *this_00;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar7;
  size_t size;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x46,"(recycler)","recycler");
    if (!bVar3) goto LAB_0096f43e;
    *puVar5 = 0;
  }
  pFVar6 = (this->functionBody).ptr;
  if (pFVar6->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x47,
                                "(profiledCallSiteId < functionBody->GetProfiledCallSiteCount())",
                                "profiledCallSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar3) goto LAB_0096f43e;
    *puVar5 = 0;
    pFVar6 = (this->functionBody).ptr;
  }
  if (pFVar6 != inlinee) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x48,"(inlinee == functionBody)","inlinee == functionBody");
    if (!bVar3) goto LAB_0096f43e;
    *puVar5 = 0;
  }
  pWVar7 = (this->inlinees).ptr;
  if (pWVar7 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    data.plusSize = (size_t)((this->functionBody).ptr)->profiledCallSiteCount;
    local_58 = (undefined1  [8])&Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_4aeb28e;
    data.filename._0_4_ = 0x4b;
    this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_58);
    uVar1 = ((this->functionBody).ptr)->profiledCallSiteCount;
    if (uVar1 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
      pWVar7 = (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)&DAT_00000008;
    }
    else {
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_0096f43e;
        *puVar5 = 0;
      }
      size = (ulong)uVar1 << 3;
      pWVar7 = (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)
               Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                         (this_00,size);
      if (pWVar7 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) {
LAB_0096f43e:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      memset(pWVar7,0,size);
    }
    addr = &this->inlinees;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pWVar7;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    pWVar7 = addr->ptr;
  }
  pWVar7 = pWVar7 + profiledCallSiteId;
  Memory::Recycler::WBSetBit((char *)pWVar7);
  pWVar7->ptr = this;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar7);
  return;
}

Assistant:

void FunctionCodeGenRuntimeData::SetupRecursiveInlineeChain(
        Recycler *const recycler,
        const ProfileId profiledCallSiteId,
        FunctionBody *const inlinee)
    {
        Assert(recycler);
        Assert(profiledCallSiteId < functionBody->GetProfiledCallSiteCount());
        Assert(inlinee == functionBody);
        if (!inlinees)
        {
            inlinees = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenRuntimeData*), functionBody->GetProfiledCallSiteCount());
        }
        inlinees[profiledCallSiteId] = this;
    }